

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void load_vector_int<QPDF::HPageOffsetEntry,long_long>
               (BitStream *bit_stream,int nitems,
               vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *vec,
               int bits_wanted,offset_in_HPageOffsetEntry_to_long_long field)

{
  pointer pHVar1;
  pointer pHVar2;
  int iVar3;
  unsigned_long uVar4;
  reference pvVar5;
  logic_error *this;
  ulong __n;
  int nitems_local;
  int bits_wanted_local;
  BitStream *local_98;
  offset_in_HPageOffsetEntry_to_long_long local_90;
  HPageOffsetEntry local_88;
  
  pHVar1 = (vec->super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pHVar2 = (vec->super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __n = 0;
  nitems_local = nitems;
  bits_wanted_local = bits_wanted;
  local_98 = bit_stream;
  local_90 = field;
  while( true ) {
    uVar4 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&nitems_local);
    if (uVar4 <= __n) break;
    if (pHVar1 == pHVar2) {
      local_88.shared_numerators.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.delta_content_offset = 0;
      local_88.shared_numerators.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.shared_numerators.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.shared_identifiers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.shared_identifiers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.nshared_objects = 0;
      local_88._20_4_ = 0;
      local_88.shared_identifiers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.delta_nobjects = 0;
      local_88._4_4_ = 0;
      local_88.delta_page_length = 0;
      local_88.delta_content_length = 0;
      std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::
      emplace_back<QPDF::HPageOffsetEntry>(vec,&local_88);
      QPDF::HPageOffsetEntry::~HPageOffsetEntry(&local_88);
    }
    uVar4 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&bits_wanted_local);
    iVar3 = BitStream::getBitsInt(local_98,uVar4);
    pvVar5 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (vec,__n);
    *(long *)((long)&pvVar5->delta_nobjects + local_90) = (long)iVar3;
    __n = __n + 1;
  }
  local_88._0_8_ =
       ((long)(vec->
              super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>).
              _M_impl.super__Vector_impl_data._M_finish -
       (long)(vec->
             super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>).
             _M_impl.super__Vector_impl_data._M_start) / 0x58;
  iVar3 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert((unsigned_long *)&local_88);
  if (iVar3 == nitems_local) {
    BitStream::skipToNextByte(local_98);
    return;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"vector has wrong size in load_vector_int");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static void
load_vector_int(
    BitStream& bit_stream, int nitems, std::vector<T>& vec, int bits_wanted, int_type T::* field)
{
    bool append = vec.empty();
    // nitems times, read bits_wanted from the given bit stream, storing results in the ith vector
    // entry.

    for (size_t i = 0; i < QIntC::to_size(nitems); ++i) {
        if (append) {
            vec.push_back(T());
        }
        vec.at(i).*field = bit_stream.getBitsInt(QIntC::to_size(bits_wanted));
    }
    if (QIntC::to_int(vec.size()) != nitems) {
        throw std::logic_error("vector has wrong size in load_vector_int");
    }
    // The PDF spec says that each hint table starts at a byte boundary.  Each "row" actually must
    // start on a byte boundary.
    bit_stream.skipToNextByte();
}